

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PODVector.H
# Opt level: O2

void __thiscall
amrex::PODVector<int,_std::allocator<int>_>::resize
          (PODVector<int,_std::allocator<int>_> *this,size_type a_new_size,int *a_val)

{
  ulong uVar1;
  
  uVar1 = this->m_size;
  resize(this,a_new_size);
  if (uVar1 < a_new_size) {
    std::__fill_n_a<int*,unsigned_long,int>(this->m_data + uVar1,this->m_size - uVar1,a_val);
  }
  return;
}

Assistant:

void resize (size_type a_new_size, const T& a_val) noexcept
        {
            size_type old_size = size();
            resize(a_new_size);
            if (old_size < a_new_size)
            {
                detail::uninitializedFillNImpl<Allocator>(m_data + old_size,
                                                          size() - old_size,
                                                          a_val, *this);
            }
        }